

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

GLint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::getMaximumImageUniformsForStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  uint in_EAX;
  GLenum GVar1;
  TestError *this_00;
  CallLogWrapper *this_01;
  ulong uStack_18;
  GLint max_image_uniforms;
  
  uStack_18 = (ulong)in_EAX;
  if (stage == fragmentShaderStage) {
    GVar1 = 0x90ce;
  }
  else if (stage == vertexShaderStage) {
    GVar1 = 0x90ca;
  }
  else if (stage == tesselationControlShaderStage) {
    GVar1 = 0x90cb;
  }
  else if (stage == tesselationEvalutaionShaderStage) {
    GVar1 = 0x90cc;
  }
  else {
    if (stage != geometryShaderStage) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid shader stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                 ,0x2412);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar1 = 0x90cd;
  }
  this_01 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_01,GVar1,&max_image_uniforms);
  GVar1 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar1,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2416);
  return max_image_uniforms;
}

Assistant:

GLint getMaximumImageUniformsForStage(shaderStage stage)
	{
		GLint  max_image_uniforms = 0;
		GLenum pname			  = 0;

		switch (stage)
		{
		case fragmentShaderStage:
			pname = GL_MAX_FRAGMENT_IMAGE_UNIFORMS;
			break;

		case geometryShaderStage:
			pname = GL_MAX_GEOMETRY_IMAGE_UNIFORMS;
			break;

		case tesselationControlShaderStage:
			pname = GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS;
			break;

		case tesselationEvalutaionShaderStage:
			pname = GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS;
			break;

		case vertexShaderStage:
			pname = GL_MAX_VERTEX_IMAGE_UNIFORMS;
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		glGetIntegerv(pname, &max_image_uniforms);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetIntegerv");

		return max_image_uniforms;
	}